

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountCase::init
          (VaryingOutputCountCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  VaryingSource VVar4;
  ShaderInstancingMode SVar5;
  VaryingOutputCountShader *this_00;
  undefined8 uVar6;
  bool bVar7;
  ContextType ctxType;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ShaderProgramDeclaration *pSVar9;
  size_t sVar10;
  pointer __dest;
  ostream *poVar11;
  UniformSlot *pUVar12;
  TestError *pTVar13;
  NotSupportedError *pNVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  char *pcVar18;
  bool *__s;
  GLint maxComponents;
  ostringstream buf;
  GLint maxTextures;
  ContextType local_51c;
  string local_518;
  VaryingOutputCountShader *local_4f8;
  long *local_4f0;
  long local_4e8;
  long local_4e0 [2];
  Uniform local_4d0;
  string local_4a8;
  VertexSource local_488;
  long *local_468;
  undefined8 local_460;
  long local_458;
  undefined2 local_450;
  undefined1 local_44e;
  undefined7 *local_448;
  undefined8 local_440;
  undefined7 local_438;
  undefined4 uStack_431;
  undefined1 local_42d;
  long *local_428;
  undefined8 local_420;
  long local_418;
  undefined2 local_410;
  FragmentOutput local_404;
  VertexAttribute local_400;
  VertexAttribute local_3d8;
  Uniform local_3b0;
  string local_388;
  GeometrySource local_368;
  string local_348;
  FragmentSource local_328;
  string local_308;
  undefined1 local_2e8 [112];
  ios_base local_278 [8];
  ios_base local_270 [264];
  GeometryToFragmentVarying local_168;
  VertexToGeometryVarying local_160;
  GeometryShaderDeclaration local_158;
  ShaderProgramDeclaration local_140;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar7) {
    bVar7 = glu::ContextInfo::isExtensionSupported
                      (((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->
                       m_contextInfo,"GL_EXT_geometry_shader");
    if (!bVar7) {
      pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar14,"Tests require GL_EXT_geometry_shader extension or higher context version."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                 ,0xe9a);
      __cxa_throw(pNVar14,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if (this->m_test == READ_TEXTURE) {
    local_140.m_vertexAttributes.
    super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    iVar8 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar8) + 0x868))(0x8c29,&local_140);
    local_2e8._0_8_ =
         ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_2e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS = ",0x26);
    std::ostream::operator<<
              (poVar1,(uint)local_140.m_vertexAttributes.
                            super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_270);
    if ((int)(uint)local_140.m_vertexAttributes.
                   super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                   ._M_impl.super__Vector_impl_data._M_start < 1) {
      pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_2e8._0_8_ = local_2e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2e8,"Geometry shader texture units required","");
      tcu::NotSupportedError::NotSupportedError(pNVar14,(string *)local_2e8);
      __cxa_throw(pNVar14,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_140.m_vertexAttributes.
  super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_4d0.name._M_dataplus._M_p = (pointer)((ulong)local_4d0.name._M_dataplus._M_p._4_4_ << 0x20);
  iVar8 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar8) + 0x868))(0x8de0,&local_140);
  iVar8 = (*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar8) + 0x868))(0x8de1,&local_4d0);
  local_2e8._0_8_ =
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_2e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"GL_MAX_GEOMETRY_OUTPUT_VERTICES = ",0x22);
  std::ostream::operator<<
            (poVar1,(uint)local_140.m_vertexAttributes.
                          super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_270);
  local_2e8._0_8_ =
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_2e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS = ",0x2a);
  std::ostream::operator<<(poVar1,(uint)local_4d0.name._M_dataplus._M_p);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_270);
  local_2e8._0_8_ =
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_2e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Components per vertex = ",0x18);
  std::ostream::operator<<(poVar1,8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_270);
  if ((int)(uint)local_140.m_vertexAttributes.
                 super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                 ._M_impl.super__Vector_impl_data._M_start < 0x100) {
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    local_2e8._0_8_ = local_2e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2e8,
               "MAX_GEOMETRY_OUTPUT_VERTICES was less than minimum required (256)","");
    tcu::TestError::TestError(pTVar13,(string *)local_2e8);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if ((int)(uint)local_4d0.name._M_dataplus._M_p < 0x400) {
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    local_2e8._0_8_ = local_2e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2e8,
               "MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS was less than minimum required (1024)","");
    tcu::TestError::TestError(pTVar13,(string *)local_2e8);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar15 = (uint)local_4d0.name._M_dataplus._M_p >> 3;
  if ((uint)local_140.m_vertexAttributes.
            super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
            ._M_impl.super__Vector_impl_data._M_start < (uint)local_4d0.name._M_dataplus._M_p >> 3)
  {
    uVar15 = (uint)local_140.m_vertexAttributes.
                   super__Vector_base<sglr::pdec::VertexAttribute,_std::allocator<sglr::pdec::VertexAttribute>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  }
  this->m_maxEmitCount = uVar15;
  local_2e8._0_8_ =
       ((this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_2e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering 4 n-gons with n = ",0x1c);
  std::ostream::operator<<(poVar1,6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,this->m_maxEmitCount);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", and ",6);
  std::ostream::operator<<(poVar1,10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"N is supplied to the geomery shader with ",0x29);
  VVar4 = this->m_test;
  pcVar16 = "texture";
  if (VVar4 == READ_UNIFORM) {
    pcVar16 = "uniform";
  }
  pcVar18 = "attribute";
  if (VVar4 != READ_ATTRIBUTE) {
    pcVar18 = pcVar16;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pcVar18,(ulong)(VVar4 == READ_ATTRIBUTE) * 2 + 7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_270);
  SVar5 = this->m_mode;
  local_4f8 = (VaryingOutputCountShader *)operator_new(0x170);
  local_51c.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  VVar4 = this->m_test;
  iVar8 = this->m_maxEmitCount;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_428 = &local_418;
  local_418 = 0x656c706d61735f75;
  local_410 = 0x72;
  local_420 = 9;
  local_4d0.name._M_dataplus._M_p = (pointer)&local_4d0.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_4d0,local_428,(long)&local_410 + 1);
  local_4d0.type = TYPE_SAMPLER_2D;
  pSVar9 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_4d0);
  local_448 = &local_438;
  local_438 = 0x4374696d655f75;
  uStack_431 = 0x746e756f;
  local_440 = 0xb;
  local_42d = 0;
  local_3b0.name._M_dataplus._M_p = (pointer)&local_3b0.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_3b0);
  local_3b0.type = TYPE_INT_VEC4;
  pSVar9 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar9,&local_3b0);
  local_468 = &local_458;
  local_458 = 0x697469736f705f61;
  local_450 = 0x6e6f;
  local_460 = 10;
  local_44e = 0;
  local_3d8.name._M_dataplus._M_p = (pointer)&local_3d8.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_3d8);
  local_3d8.type = GENERICVECTYPE_FLOAT;
  pSVar9 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar9,&local_3d8);
  if (VVar4 < READ_LAST) {
    __s = (bool *)(&DAT_009466d8 + *(int *)(&DAT_009466d8 + (ulong)VVar4 * 4));
  }
  else {
    __s = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  local_4f0 = local_4e0;
  sVar10 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,__s,__s + sVar10);
  local_400.name._M_dataplus._M_p = (pointer)&local_400.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_4f0,local_4e8 + (long)local_4f0);
  local_400.type = GENERICVECTYPE_FLOAT;
  pSVar9 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar9,&local_400);
  local_160.type = GENERICVECTYPE_FLOAT;
  local_160.flatshade = false;
  pSVar9 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar9,&local_160);
  local_168.type = GENERICVECTYPE_FLOAT;
  local_168.flatshade = false;
  pSVar9 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar9,&local_168);
  local_404.type = GENERICVECTYPE_FLOAT;
  pSVar9 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar9,&local_404);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,"${GLSL_VERSION_DECL}\nin highp vec4 a_position;\n",0x2f);
  if (VVar4 == READ_ATTRIBUTE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2e8,"in highp vec4 a_emitCount;\n",0x1b);
    pcVar16 = "out highp vec4 v_geom_emitCount;\n";
LAB_003a2682:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,pcVar16,0x21);
  }
  else if (VVar4 < READ_LAST) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2e8,"in highp vec4 a_vertexNdx;\n",0x1b);
    pcVar16 = "out highp vec4 v_geom_vertexNdx;\n";
    goto LAB_003a2682;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,"void main (void)\n{\n\tgl_Position = a_position;\n",0x2e);
  if (VVar4 == READ_ATTRIBUTE) {
    pcVar16 = "\tv_geom_emitCount = a_emitCount;\n";
LAB_003a26c6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,pcVar16,0x21);
  }
  else if (VVar4 < READ_LAST) {
    pcVar16 = "\tv_geom_vertexNdx = a_vertexNdx;\n";
    goto LAB_003a26c6;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,"}\n",2);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_308,&local_518,&local_51c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
  std::ios_base::~ios_base(local_278);
  local_488.source._M_dataplus._M_p = (pointer)&local_488.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_488,local_308._M_dataplus._M_p,
             local_308._M_dataplus._M_p + local_308._M_string_length);
  pSVar9 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar9,&local_488);
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  local_2e8._0_8_ = (TestLog *)0x9c;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_4a8,(ulong)local_2e8);
  uVar6 = local_2e8._0_8_;
  local_4a8.field_2._M_allocated_capacity = local_2e8._0_8_;
  local_4a8._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
         ,0x9c);
  local_4a8._M_string_length = uVar6;
  __dest[uVar6] = '\0';
  specializeShader(&local_348,&local_4a8,&local_51c);
  this_00 = local_4f8;
  paVar2 = &local_328.source.field_2;
  local_328.source._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_328,local_348._M_dataplus._M_p,
             local_348._M_dataplus._M_p + local_348._M_string_length);
  pSVar9 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar9,&local_328);
  local_158.numOutputVertices = (size_t)iVar8;
  local_158.numInvocations = (ulong)(SVar5 == MODE_WITH_INSTANCING) * 3 + 1;
  local_158.inputType = GEOMETRYSHADERINPUTTYPE_POINTS;
  local_158.outputType = GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP;
  pSVar9 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar9,&local_158);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,"${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points",
             0x3d);
  pcVar16 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (SVar5 == MODE_WITH_INSTANCING) {
    pcVar16 = ",invocations=4";
  }
  lVar17 = 0xe;
  if (SVar5 != MODE_WITH_INSTANCING) {
    lVar17 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,pcVar16,lVar17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,") in;\nlayout(triangle_strip, max_vertices = ",0x2c);
  poVar11 = (ostream *)std::ostream::operator<<(local_2e8,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,") out;\n",7);
  pcVar16 = "in highp vec4 v_geom_vertexNdx[];\nuniform highp sampler2D u_sampler;\n";
  if (VVar4 == READ_UNIFORM) {
    pcVar16 = "in highp vec4 v_geom_vertexNdx[];\nuniform highp ivec4 u_emitCount;\n";
  }
  pcVar18 = "in highp vec4 v_geom_emitCount[];\n";
  if (VVar4 != READ_ATTRIBUTE) {
    pcVar18 = pcVar16;
  }
  lVar17 = 0x22;
  if (VVar4 != READ_ATTRIBUTE) {
    lVar17 = (ulong)(VVar4 != READ_UNIFORM) * 2 + 0x43;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,pcVar18,lVar17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,"out highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n",0x35);
  if (VVar4 == READ_ATTRIBUTE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2e8,
               "\thighp vec4 attrEmitCounts = v_geom_emitCount[0];\n\tmediump int emitCount = int(attrEmitCounts["
               ,0x5e);
    pcVar16 = "0";
    if (SVar5 == MODE_WITH_INSTANCING) {
      pcVar16 = "gl_InvocationID";
    }
    lVar17 = 1;
    if (SVar5 == MODE_WITH_INSTANCING) {
      lVar17 = 0xf;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,pcVar16,lVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,"]);\n",4);
    lVar17 = 0x68;
    pcVar16 = 
    "\thighp vec4 color = vec4((emitCount < 10) ? (0.0) : (1.0), (emitCount > 10) ? (0.0) : (1.0), 1.0, 1.0);\n"
    ;
  }
  else {
    if (VVar4 == READ_TEXTURE) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2e8,"\thighp float primitiveNdx = ",0x1c);
      pcVar16 = "v_geom_vertexNdx[0].x";
      if (SVar5 == MODE_WITH_INSTANCING) {
        pcVar16 = "float(gl_InvocationID)";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2e8,pcVar16,(ulong)(SVar5 == MODE_WITH_INSTANCING) + 0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2e8,
                 ";\n\thighp vec2 texCoord = vec2(1.0 / 8.0 + primitiveNdx / 4.0, 0.5);\n\thighp vec4 texColor = texture(u_sampler, texCoord);\n\tmediump int emitCount = 0;\n\tif (texColor.x > 0.0)\n\t\temitCount += "
                 ,0xbb);
      poVar11 = (ostream *)std::ostream::operator<<(local_2e8,6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,";\n\tif (texColor.y > 0.0)\n\t\temitCount += ",0x28);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,";\n\tif (texColor.z > 0.0)\n\t\temitCount += ",0x28);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,";\n\tif (texColor.w > 0.0)\n\t\temitCount += ",0x28);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,10);
      lVar17 = 2;
      pcVar16 = ";\n";
    }
    else {
      if (VVar4 != READ_UNIFORM) goto LAB_003a2b67;
      poVar11 = (ostream *)local_2e8;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"\tmediump int primitiveNdx = ",0x1c);
      pcVar16 = "int(v_geom_vertexNdx[0].x)";
      if (SVar5 == MODE_WITH_INSTANCING) {
        pcVar16 = "gl_InvocationID";
      }
      lVar17 = 0x1a;
      if (SVar5 == MODE_WITH_INSTANCING) {
        lVar17 = 0xf;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar16,lVar17);
      lVar17 = 0x36;
      pcVar16 = ";\n\tmediump int emitCount = u_emitCount[primitiveNdx];\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar16,lVar17);
    lVar17 = 0x13f;
    pcVar16 = 
    "\n\tconst highp vec4 red = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 blue = vec4(0.0, 0.0, 1.0, 1.0);\n\tconst highp vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 colors[4] = vec4[4](red, green, blue, yellow);\n\thighp vec4 color = colors[int(primitiveNdx)];\n"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,pcVar16,lVar17);
LAB_003a2b67:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,"\n\thighp vec4 basePos = ",0x17);
  pcVar16 = "gl_in[0].gl_Position";
  if (SVar5 == MODE_WITH_INSTANCING) {
    pcVar16 = 
    "gl_in[0].gl_Position + 0.5 * vec4(cos(float(gl_InvocationID)), sin(float(gl_InvocationID)), 0.0, 0.0)"
    ;
  }
  lVar17 = 0x14;
  if (SVar5 == MODE_WITH_INSTANCING) {
    lVar17 = 0x65;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,pcVar16,lVar17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2e8,
             ";\n\tfor (mediump int i = 0; i < emitCount / 2; i++)\n\t{\n\t\thighp float angle = (float(i) + 0.5) / float(emitCount / 2) * 3.142;\n\t\tgl_Position = basePos + vec4(cos(angle),  sin(angle), 0.0, 0.0) * 0.15;\n\t\tv_frag_FragColor = color;\n\t\tEmitVertex();\n\t\tgl_Position = basePos + vec4(cos(angle), -sin(angle), 0.0, 0.0) * 0.15;\n\t\tv_frag_FragColor = color;\n\t\tEmitVertex();\n\t}}\n"
             ,0x16d);
  std::__cxx11::stringbuf::str();
  specializeShader(&local_388,&local_518,&local_51c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
  std::ios_base::~ios_base(local_278);
  paVar3 = &local_368.source.field_2;
  local_368.source._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_388._M_dataplus._M_p,
             local_388._M_dataplus._M_p + local_388._M_string_length);
  pSVar9 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar9,&local_368);
  sglr::ShaderProgram::ShaderProgram(&this_00->super_ShaderProgram,pSVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.source._M_dataplus._M_p != paVar3) {
    operator_delete(local_368.source._M_dataplus._M_p,
                    local_368.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.source._M_dataplus._M_p != paVar2) {
    operator_delete(local_328.source._M_dataplus._M_p,
                    local_328.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,(ulong)(local_4a8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.source._M_dataplus._M_p != &local_488.source.field_2) {
    operator_delete(local_488.source._M_dataplus._M_p,
                    local_488.source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.name._M_dataplus._M_p != &local_400.name.field_2) {
    operator_delete(local_400.name._M_dataplus._M_p,local_400.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_4f0 != local_4e0) {
    operator_delete(local_4f0,local_4e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.name._M_dataplus._M_p != &local_3d8.name.field_2) {
    operator_delete(local_3d8.name._M_dataplus._M_p,local_3d8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_468 != &local_458) {
    operator_delete(local_468,local_458 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.name._M_dataplus._M_p != &local_3b0.name.field_2) {
    operator_delete(local_3b0.name._M_dataplus._M_p,local_3b0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_448 != &local_438) {
    operator_delete(local_448,CONCAT17((undefined1)uStack_431,local_438) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0.name._M_dataplus._M_p != &local_4d0.name.field_2) {
    operator_delete(local_4d0.name._M_dataplus._M_p,local_4d0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_428 != &local_418) {
    operator_delete(local_428,local_418 + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this_00->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00b28950;
  (this_00->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00b28988;
  (this_00->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00b289a0;
  *(VaryingSource *)&(this_00->super_ShaderProgram).field_0x154 = VVar4;
  pUVar12 = sglr::ShaderProgram::getUniformByName(&this_00->super_ShaderProgram,"u_sampler");
  this_00->m_sampler = pUVar12;
  pcVar16 = "u_emitCount";
  pUVar12 = sglr::ShaderProgram::getUniformByName(&this_00->super_ShaderProgram,"u_emitCount");
  this_00->m_emitCount = pUVar12;
  this_00->m_maxEmitCount = iVar8;
  this_00->m_instanced = SVar5 == MODE_WITH_INSTANCING;
  this->m_program = this_00;
  iVar8 = GeometryShaderRenderTest::init
                    (&this->super_GeometryShaderRenderTest,(EVP_PKEY_CTX *)pcVar16);
  return iVar8;
}

Assistant:

void VaryingOutputCountCase::init (void)
{
	// Check requirements

	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		TCU_THROW(NotSupportedError, "Tests require GL_EXT_geometry_shader extension or higher context version.");

	if (m_test == VaryingOutputCountShader::READ_TEXTURE)
	{
		glw::GLint maxTextures = 0;

		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &maxTextures);

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS = " << maxTextures << tcu::TestLog::EndMessage;

		if (maxTextures < 1)
			throw tcu::NotSupportedError("Geometry shader texture units required");
	}

	// Get max emit count
	{
		const int	componentsPerVertex	= 4 + 4; // vec4 pos, vec4 color
		glw::GLint	maxVertices			= 0;
		glw::GLint	maxComponents		= 0;

		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_OUTPUT_VERTICES, &maxVertices);
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &maxComponents);

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_OUTPUT_VERTICES = " << maxVertices << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS = " << maxComponents << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Components per vertex = " << componentsPerVertex << tcu::TestLog::EndMessage;

		if (maxVertices < 256)
			throw tcu::TestError("MAX_GEOMETRY_OUTPUT_VERTICES was less than minimum required (256)");
		if (maxComponents < 1024)
			throw tcu::TestError("MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS was less than minimum required (1024)");

		m_maxEmitCount = de::min(maxVertices, maxComponents / componentsPerVertex);
	}

	// Log what the test tries to do

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering 4 n-gons with n = "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_0 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_0)) << ", "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_1 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_1)) << ", "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_2 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_2)) << ", and "
		<< ((VaryingOutputCountShader::EMIT_COUNT_VERTEX_3 == -1) ? (m_maxEmitCount) : (VaryingOutputCountShader::EMIT_COUNT_VERTEX_3)) << ".\n"
		<< "N is supplied to the geomery shader with "
		<< ((m_test == VaryingOutputCountShader::READ_ATTRIBUTE) ? ("attribute") : (m_test == VaryingOutputCountShader::READ_UNIFORM) ? ("uniform") : ("texture"))
		<< tcu::TestLog::EndMessage;

	// Gen shader
	{
		const bool instanced = (m_mode == MODE_WITH_INSTANCING);

		DE_ASSERT(!m_program);
		m_program = new VaryingOutputCountShader(m_context.getRenderContext().getType(), m_test, m_maxEmitCount, instanced);
	}

	// Case init
	GeometryShaderRenderTest::init();
}